

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O0

void QRadialFetchSimd<QSimdSse2>::fetch
               (uint *buffer,uint *end,Operator *op,QSpanData *data,qreal det,qreal delta_det,
               qreal delta_delta_det,qreal b,qreal delta_b)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong in_RCX;
  long in_RDX;
  uint *in_RSI;
  uint *puVar5;
  uint *in_RDI;
  longlong lVar6;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  double in_XMM1_Qa;
  undefined8 uVar11;
  double in_XMM2_Qa;
  double dVar12;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  Int32x4 alVar13;
  Int32x4 a;
  Int32x4 a_00;
  Int32x4 a_01;
  Int32x4 a_02;
  Int32x4 a_03;
  Int32x4 a_04;
  Int32x4 b_00;
  Int32x4 b_01;
  Int32x4 b_02;
  Int32x4 b_03;
  Int32x4 b_04;
  Int32x4 b_05;
  Int32x4 b_06;
  Float32x4 afVar14;
  Float32x4 a_05;
  Float32x4 a_06;
  Float32x4 a_07;
  Float32x4 a_08;
  Float32x4 a_09;
  Float32x4 a_10;
  Float32x4 a_11;
  Float32x4 a_12;
  Float32x4 x;
  Float32x4 a_13;
  Float32x4 a_14;
  Float32x4 a_15;
  Float32x4 a_16;
  Float32x4 a_17;
  Float32x4 a_18;
  Float32x4 a_19;
  Float32x4 a_20;
  Float32x4 a_21;
  Float32x4 a_22;
  Float32x4 a_23;
  Float32x4 a_24;
  Float32x4 x_00;
  Float32x4 a_25;
  Float32x4 a_26;
  Float32x4 a_27;
  Float32x4 a_28;
  Float32x4 a_29;
  Float32x4 a_30;
  Float32x4 a_31;
  Float32x4 afVar15;
  Float32x4 a_33;
  Float32x4 a_34;
  Float32x4 a_35;
  Float32x4 a_36;
  Float32x4 a_37;
  Float32x4 a_38;
  Float32x4 a_39;
  Float32x4 a_40;
  Float32x4 b_07;
  Float32x4 b_08;
  Float32x4 b_09;
  Float32x4 b_10;
  Float32x4 b_11;
  Float32x4 b_12;
  Float32x4 b_13;
  Float32x4 b_14;
  Float32x4 b_15;
  Float32x4 b_16;
  Float32x4 b_17;
  Float32x4 b_18;
  Float32x4 b_19;
  Float32x4 b_20;
  Float32x4 b_21;
  Float32x4 b_22;
  Float32x4 b_23;
  Float32x4 b_24;
  Float32x4 b_25;
  Float32x4 b_26;
  Float32x4 b_27;
  Float32x4 b_28;
  Float32x4 b_29;
  Float32x4 b_30;
  Float32x4 b_31;
  Float32x4 b_32;
  Float32x4 b_33;
  Float32x4 b_34;
  Float32x4 b_35;
  Float32x4 b_36;
  Float32x4 b_37;
  Float32x4 b_38;
  Float32x4 b_39;
  Float32x4 b_40;
  Float32x4 b_41;
  Float32x4 b_42;
  Float32x4 b_43;
  Float32x4 b_44;
  int i_3;
  Float32x4 v_index_2;
  Float32x4 v_index_local_2;
  int i_2;
  Int32x4 v_index_i_inv;
  Int32x4 v_index_i;
  Float32x4 v_index_1;
  Float32x4 v_index_local_1;
  int i_1;
  Float32x4 v_index;
  Float32x4 v_index_local;
  int extended_mask;
  Int32x4 v_reflect_limit;
  Int32x4 v_reflect_mask;
  Int32x4 v_repeat_mask;
  Float32x4 v_half;
  Float32x4 v_max;
  Float32x4 v_min;
  Float32x4 v_dr;
  Float32x4 v_r0;
  Float32x4 v_delta_b4;
  Float32x4 v_delta_delta_det6;
  Float32x4 v_delta_delta_det16;
  int i;
  Vect_buffer_i index_vec_2;
  Vect_buffer_i v_buffer_mask_2;
  Vect_buffer_i index_vec_1;
  Vect_buffer_i v_buffer_mask_1;
  Vect_buffer_i index_vec;
  Vect_buffer_i v_buffer_mask;
  Vect_buffer_f b_vec;
  Vect_buffer_f delta_det4_vec;
  Vect_buffer_f det_vec;
  int local_24c;
  int local_21c;
  int local_1cc;
  int local_e4;
  double local_d8;
  double local_c8;
  double local_c0;
  uint *local_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  ulong uVar4;
  Float32x4 a_32;
  undefined8 uVar7;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xffffffffffffffff;
  uStack_10 = 0xffffffffffffffff;
  local_28 = 0xffffffffffffffff;
  uStack_20 = 0xffffffffffffffff;
  local_38 = 0xffffffffffffffff;
  uStack_30 = 0xffffffffffffffff;
  local_d8 = in_XMM3_Qa;
  local_c8 = in_XMM1_Qa;
  local_c0 = in_XMM0_Qa;
  for (local_e4 = 0; local_e4 < 4; local_e4 = local_e4 + 1) {
    *(float *)((long)&local_18 + (long)local_e4 * 4) = (float)local_c0;
    *(float *)((long)&local_28 + (long)local_e4 * 4) = (float)(local_c8 * 4.0);
    *(float *)((long)&local_38 + (long)local_e4 * 4) = (float)local_d8;
    local_c0 = local_c8 + local_c0;
    local_c8 = in_XMM2_Qa + local_c8;
    local_d8 = in_XMM4_Qa + local_d8;
  }
  uVar4 = in_RCX;
  puVar5 = in_RSI;
  dVar12 = in_XMM2_Qa;
  afVar14 = QSimdSse2::v_dup(in_XMM2_Qa * 16.0);
  uVar7 = afVar14._0_8_;
  afVar14 = QSimdSse2::v_dup(in_XMM2_Qa * 6.0);
  uVar8 = afVar14._0_8_;
  afVar14 = QSimdSse2::v_dup(in_XMM4_Qa * 4.0);
  uVar9 = afVar14._0_8_;
  afVar14 = QSimdSse2::v_dup(*(double *)(in_RCX + 0xd8));
  a_11._0_8_ = afVar14._0_8_;
  afVar14 = QSimdSse2::v_dup(*(double *)(in_RDX + 0x90));
  a_10._0_8_ = afVar14._0_8_;
  afVar14 = QSimdSse2::v_dup(0.0);
  a_06._0_8_ = afVar14._0_8_;
  afVar14 = QSimdSse2::v_dup(1023.0);
  a_36._0_8_ = afVar14._0_8_;
  afVar14 = QSimdSse2::v_dup(0.5);
  uVar10 = afVar14._0_8_;
  QSimdSse2::v_dup(0x3ff);
  QSimdSse2::v_dup(0x7ff);
  lVar6 = 0x7ff;
  QSimdSse2::v_dup(0x7ff);
  uVar2 = (*(byte *)(in_RDX + 0xa8) & 1) - 1;
  iVar1 = *(int *)(in_RCX + 0xa8);
  local_a0 = in_RDI;
  if (iVar1 == 0) {
    while (local_a0 < in_RSI) {
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      afVar14[2] = (float)(int)a_06._0_8_;
      afVar14[3] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      afVar14[0] = (float)(undefined4)local_18;
      afVar14[1] = (float)local_18._4_4_;
      b_31._8_8_ = in_XMM3_Qa;
      b_31._0_8_ = dVar12;
      QSimdSse2::v_greaterOrEqual(afVar14,b_31);
      afVar15[2] = (float)(undefined4)local_18;
      afVar15[3] = (float)local_18._4_4_;
      afVar15[0] = (float)(int)a_06._0_8_;
      afVar15[1] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      b_32._8_8_ = in_XMM3_Qa;
      b_32._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_max(afVar15,b_32);
      afVar14 = QSimdSse2::v_sqrt(afVar14);
      a_29._0_8_ = afVar14._0_8_;
      a_29[2] = (float)(undefined4)local_38;
      a_29[3] = (float)local_38._4_4_;
      b_33._8_8_ = in_XMM3_Qa;
      b_33._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_sub(a_29,b_33);
      a_30._0_8_ = afVar14._0_8_;
      a_30[2] = (float)(int)a_36._0_8_;
      a_30[3] = (float)(int)((ulong)a_36._0_8_ >> 0x20);
      b_34._8_8_ = in_XMM3_Qa;
      b_34._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_mul(a_30,b_34);
      a_31._0_8_ = afVar14._0_8_;
      a_31[2] = (float)(int)uVar10;
      a_31[3] = (float)(int)((ulong)uVar10 >> 0x20);
      b_35._8_8_ = in_XMM3_Qa;
      b_35._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_31,b_35);
      a_32[2] = (float)(int)a_30._0_8_;
      a_32[3] = (float)(int)((ulong)a_30._0_8_ >> 0x20);
      a_32[0] = (float)(int)a_10._0_8_;
      a_32[1] = (float)(int)((ulong)a_10._0_8_ >> 0x20);
      b_36._8_8_ = in_XMM3_Qa;
      b_36._0_8_ = dVar12;
      afVar15 = QSimdSse2::v_mul(a_32,b_36);
      a_33[2] = (float)(int)afVar15._0_8_;
      a_33[3] = (float)(int)((ulong)afVar15._0_8_ >> 0x20);
      a_33[0] = (float)(int)a_11._0_8_;
      a_33[1] = (float)(int)((ulong)a_11._0_8_ >> 0x20);
      b_37._8_8_ = in_XMM3_Qa;
      b_37._0_8_ = dVar12;
      afVar15 = QSimdSse2::v_add(a_33,b_37);
      a_34._0_8_ = afVar15._0_8_;
      a_34[2] = (float)(int)a_06._0_8_;
      a_34[3] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      b_38._8_8_ = in_XMM3_Qa;
      b_38._0_8_ = dVar12;
      alVar13 = QSimdSse2::v_greaterOrEqual(a_34,b_38);
      b_06[0] = alVar13[1];
      alVar13[1] = (longlong)puVar5;
      alVar13[0] = lVar6;
      b_06[1] = uVar4;
      QSimdSse2::v_and(alVar13,b_06);
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      a_35[2] = (float)(int)afVar14._0_8_;
      a_35[3] = (float)(int)((ulong)afVar14._0_8_ >> 0x20);
      a_35[0] = (float)(int)a_06._0_8_;
      a_35[1] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      b_39._8_8_ = in_XMM3_Qa;
      b_39._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_max(a_35,b_39);
      a_36[2] = (float)(int)afVar14._0_8_;
      a_36[3] = (float)(int)((ulong)afVar14._0_8_ >> 0x20);
      b_40._8_8_ = in_XMM3_Qa;
      b_40._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_min(a_36,b_40);
      QSimdSse2::v_toInt(afVar14);
      a_37[2] = (float)(undefined4)local_28;
      a_37[3] = (float)local_28._4_4_;
      a_37[0] = (float)(undefined4)local_18;
      a_37[1] = (float)local_18._4_4_;
      b_41._8_8_ = in_XMM3_Qa;
      b_41._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_37,b_41);
      a_38._0_8_ = afVar14._0_8_;
      a_38[2] = (float)(int)uVar8;
      a_38[3] = (float)(int)((ulong)uVar8 >> 0x20);
      b_42._8_8_ = in_XMM3_Qa;
      b_42._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_38,b_42);
      local_18 = afVar14._0_8_;
      a_39[2] = (float)(int)uVar7;
      a_39[3] = (float)(int)((ulong)uVar7 >> 0x20);
      a_39[0] = (float)(undefined4)local_28;
      a_39[1] = (float)local_28._4_4_;
      b_43._8_8_ = in_XMM3_Qa;
      b_43._0_8_ = dVar12;
      uStack_10 = extraout_XMM0_Qb_05;
      afVar14 = QSimdSse2::v_add(a_39,b_43);
      local_28 = afVar14._0_8_;
      a_40[2] = (float)(int)uVar9;
      a_40[3] = (float)(int)((ulong)uVar9 >> 0x20);
      a_40[0] = (float)(undefined4)local_38;
      a_40[1] = (float)local_38._4_4_;
      b_44._8_8_ = in_XMM3_Qa;
      b_44._0_8_ = dVar12;
      uStack_20 = extraout_XMM0_Qb_06;
      afVar14 = QSimdSse2::v_add(a_40,b_44);
      local_38 = afVar14._0_8_;
      uStack_30 = extraout_XMM0_Qb_07;
      for (local_24c = 0; local_24c < 4; local_24c = local_24c + 1) {
        uVar3 = (uVar2 | *(uint *)((long)&local_88 + (long)local_24c * 4)) &
                *(uint *)(*(long *)(in_RCX + 0xe8) +
                         (long)*(int *)((long)&local_98 + (long)local_24c * 4) * 4);
        uVar4 = (ulong)uVar3;
        *local_a0 = uVar3;
        local_a0 = local_a0 + 1;
      }
    }
  }
  else if (iVar1 == 1) {
    while (local_a0 < in_RSI) {
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      a_17[2] = (float)(int)a_06._0_8_;
      a_17[3] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      a_17[0] = (float)(undefined4)local_18;
      a_17[1] = (float)local_18._4_4_;
      b_19._8_8_ = in_XMM3_Qa;
      b_19._0_8_ = dVar12;
      QSimdSse2::v_greaterOrEqual(a_17,b_19);
      a_18[2] = (float)(undefined4)local_18;
      a_18[3] = (float)local_18._4_4_;
      a_18[0] = (float)(int)a_06._0_8_;
      a_18[1] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      b_20._8_8_ = in_XMM3_Qa;
      b_20._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_max(a_18,b_20);
      afVar14 = QSimdSse2::v_sqrt(afVar14);
      a_19._0_8_ = afVar14._0_8_;
      a_19[2] = (float)(undefined4)local_38;
      a_19[3] = (float)local_38._4_4_;
      b_21._8_8_ = in_XMM3_Qa;
      b_21._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_sub(a_19,b_21);
      a_20._0_8_ = afVar14._0_8_;
      a_20[2] = (float)(int)a_36._0_8_;
      a_20[3] = (float)(int)((ulong)a_36._0_8_ >> 0x20);
      b_22._8_8_ = in_XMM3_Qa;
      b_22._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_mul(a_20,b_22);
      a_21._0_8_ = afVar14._0_8_;
      a_21[2] = (float)(int)uVar10;
      a_21[3] = (float)(int)((ulong)uVar10 >> 0x20);
      b_23._8_8_ = in_XMM3_Qa;
      b_23._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_21,b_23);
      x_00._0_8_ = afVar14._0_8_;
      a_22[2] = (float)(int)a_20._0_8_;
      a_22[3] = (float)(int)((ulong)a_20._0_8_ >> 0x20);
      a_22[0] = (float)(int)a_10._0_8_;
      a_22[1] = (float)(int)((ulong)a_10._0_8_ >> 0x20);
      b_24._8_8_ = in_XMM3_Qa;
      b_24._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_mul(a_22,b_24);
      a_23[2] = (float)(int)afVar14._0_8_;
      a_23[3] = (float)(int)((ulong)afVar14._0_8_ >> 0x20);
      a_23[0] = (float)(int)a_11._0_8_;
      a_23[1] = (float)(int)((ulong)a_11._0_8_ >> 0x20);
      b_25._8_8_ = in_XMM3_Qa;
      b_25._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_23,b_25);
      a_24._0_8_ = afVar14._0_8_;
      a_24[2] = (float)(int)a_06._0_8_;
      a_24[3] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      b_26._8_8_ = in_XMM3_Qa;
      b_26._0_8_ = dVar12;
      alVar13 = QSimdSse2::v_greaterOrEqual(a_24,b_26);
      b_02[0] = alVar13[1];
      a_01[1] = (longlong)puVar5;
      a_01[0] = lVar6;
      b_02[1] = uVar4;
      uVar11 = extraout_XMM0_Qa_00;
      QSimdSse2::v_and(a_01,b_02);
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      x_00[2] = (float)(int)uVar11;
      x_00[3] = (float)(int)((ulong)uVar11 >> 0x20);
      alVar13 = QSimdSse2::v_toInt(x_00);
      b_03[0] = alVar13[1];
      a_02[1] = (longlong)puVar5;
      a_02[0] = lVar6;
      b_03[1] = uVar4;
      alVar13 = QSimdSse2::v_and(a_02,b_03);
      b_04[0] = alVar13[1];
      a_03[1] = (longlong)puVar5;
      a_03[0] = lVar6;
      b_04[1] = uVar4;
      alVar13 = QSimdSse2::v_sub(a_03,b_04);
      b_05[0] = alVar13[1];
      a_04[1] = (longlong)puVar5;
      a_04[0] = lVar6;
      b_05[1] = uVar4;
      QSimdSse2::v_min_16(a_04,b_05);
      a_25[2] = (float)(undefined4)local_28;
      a_25[3] = (float)local_28._4_4_;
      a_25[0] = (float)(undefined4)local_18;
      a_25[1] = (float)local_18._4_4_;
      b_27._8_8_ = in_XMM3_Qa;
      b_27._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_25,b_27);
      a_26._0_8_ = afVar14._0_8_;
      a_26[2] = (float)(int)uVar8;
      a_26[3] = (float)(int)((ulong)uVar8 >> 0x20);
      b_28._8_8_ = in_XMM3_Qa;
      b_28._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_26,b_28);
      local_18 = afVar14._0_8_;
      a_27[2] = (float)(int)uVar7;
      a_27[3] = (float)(int)((ulong)uVar7 >> 0x20);
      a_27[0] = (float)(undefined4)local_28;
      a_27[1] = (float)local_28._4_4_;
      b_29._8_8_ = in_XMM3_Qa;
      b_29._0_8_ = dVar12;
      uStack_10 = extraout_XMM0_Qb_02;
      afVar14 = QSimdSse2::v_add(a_27,b_29);
      local_28 = afVar14._0_8_;
      a_28[2] = (float)(int)uVar9;
      a_28[3] = (float)(int)((ulong)uVar9 >> 0x20);
      a_28[0] = (float)(undefined4)local_38;
      a_28[1] = (float)local_38._4_4_;
      b_30._8_8_ = in_XMM3_Qa;
      b_30._0_8_ = dVar12;
      uStack_20 = extraout_XMM0_Qb_03;
      afVar14 = QSimdSse2::v_add(a_28,b_30);
      local_38 = afVar14._0_8_;
      uStack_30 = extraout_XMM0_Qb_04;
      for (local_21c = 0; local_21c < 4; local_21c = local_21c + 1) {
        uVar3 = (uVar2 | *(uint *)((long)&local_68 + (long)local_21c * 4)) &
                *(uint *)(*(long *)(in_RCX + 0xe8) +
                         (long)*(int *)((long)&local_78 + (long)local_21c * 4) * 4);
        uVar4 = (ulong)uVar3;
        *local_a0 = uVar3;
        local_a0 = local_a0 + 1;
      }
    }
  }
  else if (iVar1 == 2) {
    while (local_a0 < in_RSI) {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      a_05[2] = (float)(int)a_06._0_8_;
      a_05[3] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      a_05[0] = (float)(undefined4)local_18;
      a_05[1] = (float)local_18._4_4_;
      b_07._8_8_ = in_XMM3_Qa;
      b_07._0_8_ = dVar12;
      QSimdSse2::v_greaterOrEqual(a_05,b_07);
      a_06[2] = (float)(undefined4)local_18;
      a_06[3] = (float)local_18._4_4_;
      b_08._8_8_ = in_XMM3_Qa;
      b_08._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_max(a_06,b_08);
      afVar14 = QSimdSse2::v_sqrt(afVar14);
      a_07._0_8_ = afVar14._0_8_;
      a_07[2] = (float)(undefined4)local_38;
      a_07[3] = (float)local_38._4_4_;
      b_09._8_8_ = in_XMM3_Qa;
      b_09._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_sub(a_07,b_09);
      a_08._0_8_ = afVar14._0_8_;
      a_08[2] = (float)(int)a_36._0_8_;
      a_08[3] = (float)(int)((ulong)a_36._0_8_ >> 0x20);
      b_10._8_8_ = in_XMM3_Qa;
      b_10._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_mul(a_08,b_10);
      a_09._0_8_ = afVar14._0_8_;
      a_09[2] = (float)(int)uVar10;
      a_09[3] = (float)(int)((ulong)uVar10 >> 0x20);
      b_11._8_8_ = in_XMM3_Qa;
      b_11._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_09,b_11);
      x._0_8_ = afVar14._0_8_;
      a_10[2] = (float)(int)a_08._0_8_;
      a_10[3] = (float)(int)((ulong)a_08._0_8_ >> 0x20);
      b_12._8_8_ = in_XMM3_Qa;
      b_12._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_mul(a_10,b_12);
      a_11[2] = (float)(int)afVar14._0_8_;
      a_11[3] = (float)(int)((ulong)afVar14._0_8_ >> 0x20);
      b_13._8_8_ = in_XMM3_Qa;
      b_13._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_11,b_13);
      a_12._0_8_ = afVar14._0_8_;
      a_12[2] = (float)(int)a_06._0_8_;
      a_12[3] = (float)(int)((ulong)a_06._0_8_ >> 0x20);
      b_14._8_8_ = in_XMM3_Qa;
      b_14._0_8_ = dVar12;
      alVar13 = QSimdSse2::v_greaterOrEqual(a_12,b_14);
      b_00[0] = alVar13[1];
      a[1] = (longlong)puVar5;
      a[0] = lVar6;
      b_00[1] = uVar4;
      uVar11 = extraout_XMM0_Qa;
      QSimdSse2::v_and(a,b_00);
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      x[2] = (float)(int)uVar11;
      x[3] = (float)(int)((ulong)uVar11 >> 0x20);
      alVar13 = QSimdSse2::v_toInt(x);
      b_01[0] = alVar13[1];
      a_00[1] = (longlong)puVar5;
      a_00[0] = lVar6;
      b_01[1] = uVar4;
      QSimdSse2::v_and(a_00,b_01);
      a_13[2] = (float)(undefined4)local_28;
      a_13[3] = (float)local_28._4_4_;
      a_13[0] = (float)(undefined4)local_18;
      a_13[1] = (float)local_18._4_4_;
      b_15._8_8_ = in_XMM3_Qa;
      b_15._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_13,b_15);
      a_14._0_8_ = afVar14._0_8_;
      a_14[2] = (float)(int)uVar8;
      a_14[3] = (float)(int)((ulong)uVar8 >> 0x20);
      b_16._8_8_ = in_XMM3_Qa;
      b_16._0_8_ = dVar12;
      afVar14 = QSimdSse2::v_add(a_14,b_16);
      local_18 = afVar14._0_8_;
      a_15[2] = (float)(int)uVar7;
      a_15[3] = (float)(int)((ulong)uVar7 >> 0x20);
      a_15[0] = (float)(undefined4)local_28;
      a_15[1] = (float)local_28._4_4_;
      b_17._8_8_ = in_XMM3_Qa;
      b_17._0_8_ = dVar12;
      uStack_10 = extraout_XMM0_Qb;
      afVar14 = QSimdSse2::v_add(a_15,b_17);
      local_28 = afVar14._0_8_;
      a_16[2] = (float)(int)uVar9;
      a_16[3] = (float)(int)((ulong)uVar9 >> 0x20);
      a_16[0] = (float)(undefined4)local_38;
      a_16[1] = (float)local_38._4_4_;
      b_18._8_8_ = in_XMM3_Qa;
      b_18._0_8_ = dVar12;
      uStack_20 = extraout_XMM0_Qb_00;
      afVar14 = QSimdSse2::v_add(a_16,b_18);
      local_38 = afVar14._0_8_;
      uStack_30 = extraout_XMM0_Qb_01;
      for (local_1cc = 0; local_1cc < 4; local_1cc = local_1cc + 1) {
        uVar3 = (uVar2 | *(uint *)((long)&local_48 + (long)local_1cc * 4)) &
                *(uint *)(*(long *)(in_RCX + 0xe8) +
                         (long)*(int *)((long)&local_58 + (long)local_1cc * 4) * 4);
        uVar4 = (ulong)uVar3;
        *local_a0 = uVar3;
        local_a0 = local_a0 + 1;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fetch(uint *buffer, uint *end, const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        typename Simd::Vect_buffer_f det_vec;
        typename Simd::Vect_buffer_f delta_det4_vec;
        typename Simd::Vect_buffer_f b_vec;

        for (int i = 0; i < 4; ++i) {
            det_vec.f[i] = det;
            delta_det4_vec.f[i] = 4 * delta_det;
            b_vec.f[i] = b;

            det += delta_det;
            delta_det += delta_delta_det;
            b += delta_b;
        }

        const typename Simd::Float32x4 v_delta_delta_det16 = Simd::v_dup(16 * delta_delta_det);
        const typename Simd::Float32x4 v_delta_delta_det6 = Simd::v_dup(6 * delta_delta_det);
        const typename Simd::Float32x4 v_delta_b4 = Simd::v_dup(4 * delta_b);

        const typename Simd::Float32x4 v_r0 = Simd::v_dup(data->gradient.radial.focal.radius);
        const typename Simd::Float32x4 v_dr = Simd::v_dup(op->radial.dr);

#if defined(__ARM_NEON__)
        // NEON doesn't have SIMD sqrt, but uses rsqrt instead that can't be taken of 0.
        const typename Simd::Float32x4 v_min = Simd::v_dup(std::numeric_limits<float>::epsilon());
#else
        const typename Simd::Float32x4 v_min = Simd::v_dup(0.0f);
#endif
        const typename Simd::Float32x4 v_max = Simd::v_dup(float(GRADIENT_STOPTABLE_SIZE-1));
        const typename Simd::Float32x4 v_half = Simd::v_dup(0.5f);

        const typename Simd::Int32x4 v_repeat_mask = Simd::v_dup(~(uint(0xffffff) << GRADIENT_STOPTABLE_SIZE_SHIFT));
        const typename Simd::Int32x4 v_reflect_mask = Simd::v_dup(~(uint(0xffffff) << (GRADIENT_STOPTABLE_SIZE_SHIFT+1)));

        const typename Simd::Int32x4 v_reflect_limit = Simd::v_dup(2 * GRADIENT_STOPTABLE_SIZE - 1);

        const int extended_mask = op->radial.extended ? 0x0 : ~0x0;

#define FETCH_RADIAL_LOOP_PROLOGUE \
        while (buffer < end) { \
            typename Simd::Vect_buffer_i v_buffer_mask; \
            v_buffer_mask.v = Simd::v_greaterOrEqual(det_vec.v, v_min); \
            const typename Simd::Float32x4 v_index_local = Simd::v_sub(Simd::v_sqrt(Simd::v_max(v_min, det_vec.v)), b_vec.v); \
            const typename Simd::Float32x4 v_index = Simd::v_add(Simd::v_mul(v_index_local, v_max), v_half); \
            v_buffer_mask.v = Simd::v_and(v_buffer_mask.v, Simd::v_greaterOrEqual(Simd::v_add(v_r0, Simd::v_mul(v_dr, v_index_local)), v_min)); \
            typename Simd::Vect_buffer_i index_vec;
#define FETCH_RADIAL_LOOP_CLAMP_REPEAT \
            index_vec.v = Simd::v_and(v_repeat_mask, Simd::v_toInt(v_index));
#define FETCH_RADIAL_LOOP_CLAMP_REFLECT \
            const typename Simd::Int32x4 v_index_i = Simd::v_and(v_reflect_mask, Simd::v_toInt(v_index)); \
            const typename Simd::Int32x4 v_index_i_inv = Simd::v_sub(v_reflect_limit, v_index_i); \
            index_vec.v = Simd::v_min_16(v_index_i, v_index_i_inv);
#define FETCH_RADIAL_LOOP_CLAMP_PAD \
            index_vec.v = Simd::v_toInt(Simd::v_min(v_max, Simd::v_max(v_min, v_index)));
#define FETCH_RADIAL_LOOP_EPILOGUE \
            det_vec.v = Simd::v_add(Simd::v_add(det_vec.v, delta_det4_vec.v), v_delta_delta_det6); \
            delta_det4_vec.v = Simd::v_add(delta_det4_vec.v, v_delta_delta_det16); \
            b_vec.v = Simd::v_add(b_vec.v, v_delta_b4); \
            for (int i = 0; i < 4; ++i) \
                *buffer++ = (extended_mask | v_buffer_mask.i[i]) & data->gradient.colorTable32[index_vec.i[i]]; \
        }

#define FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP) \
        FETCH_RADIAL_LOOP_PROLOGUE \
        FETCH_RADIAL_LOOP_CLAMP \
        FETCH_RADIAL_LOOP_EPILOGUE

        switch (data->gradient.spread) {
        case QGradient::RepeatSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_REPEAT)
            break;
        case QGradient::ReflectSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_REFLECT)
            break;
        case QGradient::PadSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_PAD)
            break;
        default:
            Q_UNREACHABLE();
        }
    }